

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void api_fixed_suite::fixed_first_unused_segment_const(void)

{
  initializer_list<int> __l;
  allocator_type local_49;
  array<int,_4UL> array;
  vector<int,_std::allocator<int>_> expect;
  int local_20 [2];
  
  array._M_elems[0] = 0xb;
  array._M_elems[1] = 0x16;
  array._M_elems[2] = 0;
  array._M_elems[3] = 0;
  local_20[0] = 0;
  local_20[1] = 0;
  __l._M_len = 2;
  __l._M_array = local_20;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_49);
  boost::detail::
  test_all_eq_impl<std::ostream,int_const*,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x4c7,"void api_fixed_suite::fixed_first_unused_segment_const()",array._M_elems + 2,
             (int *)&expect,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void fixed_first_unused_segment_const()
{
    std::array<int, 4> array = { 11, 22 };
    const circular_view<int, 4> span(array.begin(), array.end(), array.begin(), 2);
    auto segment = span.first_unused_segment();
    {
        std::vector<int> expect = { 0, 0 };
        BOOST_TEST_ALL_EQ(segment.data(), segment.data() + segment.size(),
                          expect.begin(), expect.end());
    }
}